

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t op_vec_mdot(axbVec_s *x,size_t num_vecs,axbVec_s **y,axbScalar_s **mdot,void *aux_data)

{
  double dVar1;
  void *pvVar2;
  axbScalar_s *paVar3;
  size_t i;
  size_t i_3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pvVar2 = x->data;
LAB_00108206:
  switch(num_vecs) {
  case 0:
    return 0;
  case 1:
    dVar5 = 0.0;
    for (sVar4 = 0; x->size != sVar4; sVar4 = sVar4 + 1) {
      dVar5 = dVar5 + *(double *)((long)pvVar2 + sVar4 * 8) *
                      *(double *)((long)(*y)->data + sVar4 * 8);
    }
    paVar3 = *mdot;
    break;
  case 2:
    dVar5 = 0.0;
    dVar6 = 0.0;
    for (sVar4 = 0; x->size != sVar4; sVar4 = sVar4 + 1) {
      dVar7 = *(double *)((long)pvVar2 + sVar4 * 8);
      dVar5 = dVar5 + *(double *)((long)(*y)->data + sVar4 * 8) * dVar7;
      dVar6 = dVar6 + *(double *)((long)y[1]->data + sVar4 * 8) * dVar7;
    }
    *(double *)(*mdot)->data = dVar5;
    *(double *)mdot[1]->data = dVar6;
    num_vecs = 0;
    goto LAB_00108206;
  case 3:
    dVar6 = 0.0;
    dVar7 = 0.0;
    dVar5 = 0.0;
    for (sVar4 = 0; x->size != sVar4; sVar4 = sVar4 + 1) {
      dVar8 = *(double *)((long)pvVar2 + sVar4 * 8);
      dVar6 = dVar6 + *(double *)((long)(*y)->data + sVar4 * 8) * dVar8;
      dVar7 = dVar7 + *(double *)((long)y[1]->data + sVar4 * 8) * dVar8;
      dVar5 = dVar5 + dVar8 * *(double *)((long)y[2]->data + sVar4 * 8);
    }
    *(double *)(*mdot)->data = dVar6;
    *(double *)mdot[1]->data = dVar7;
    paVar3 = mdot[2];
    break;
  default:
    goto switchD_00108217_default;
  }
  *(double *)paVar3->data = dVar5;
  num_vecs = 0;
  goto LAB_00108206;
switchD_00108217_default:
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  for (sVar4 = 0; x->size != sVar4; sVar4 = sVar4 + 1) {
    dVar1 = *(double *)((long)pvVar2 + sVar4 * 8);
    dVar5 = dVar5 + *(double *)((long)y[2]->data + sVar4 * 8) * dVar1;
    dVar6 = dVar6 + *(double *)((long)y[3]->data + sVar4 * 8) * dVar1;
    dVar7 = dVar7 + *(double *)((long)(*y)->data + sVar4 * 8) * dVar1;
    dVar8 = dVar8 + *(double *)((long)y[1]->data + sVar4 * 8) * dVar1;
  }
  *(double *)(*mdot)->data = dVar7;
  *(double *)mdot[1]->data = dVar8;
  *(double *)mdot[2]->data = dVar5;
  *(double *)mdot[3]->data = dVar6;
  y = y + 4;
  mdot = mdot + 4;
  num_vecs = num_vecs - 4;
  goto LAB_00108206;
}

Assistant:

static axbStatus_t op_vec_mdot(const struct axbVec_s *x, size_t num_vecs, const struct axbVec_s **y, struct axbScalar_s **mdot, void *aux_data)
{
  (void)aux_data;

  const double *d_x = x->data;
  double val_x = 0;

  // auxiliary variables
  double m[4] = {0};

  while (num_vecs) {
    m[0] = m[1] = m[2] = m[3] = 0;

    // 'unrolling' for up to four right hand sides y simultaneously.
    // This leverages most of the performance benefits by reducing memory transfers.
    // Further optimizations by unrolling up to 8 vectors are possible.
    // Unrolling to 9+ vectors results in diminishing returns (<10 percent gain)
    switch (num_vecs) {
    case 3:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
        m[2] += val_x * ((const double*)y[2]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];
      *((double*)mdot[2]->data) = m[2];

      num_vecs = 0;
      break;
    case 2:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];

      num_vecs = 0;
      break;
    case 1:
      for (size_t i=0; i<x->size; ++i) {
        m[0] += d_x[i] * ((const double*)y[0]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];

      num_vecs = 0;
      break;
    default:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
        m[2] += val_x * ((const double*)y[2]->data)[i];
        m[3] += val_x * ((const double*)y[3]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];
      *((double*)mdot[2]->data) = m[2];
      *((double*)mdot[3]->data) = m[3];

      y += 4;
      mdot += 4;
      num_vecs -= 4;
      break;
    }
  } // while

  return 0;
}